

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table_impl.h
# Opt level: O1

ht_item_t_conflict5
ht_insert(hash_table_t *ht,void *key,size_t len,ht_item_t_conflict5 new_item,int mode)

{
  ushort uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ht_item_t_conflict5 pfVar5;
  ulong uVar6;
  ulong extraout_RDX;
  void *pvVar7;
  hash_table_t *ht_00;
  size_t *psVar8;
  size_t *psVar9;
  fb_value_t *value;
  bool bVar10;
  
  if (len == 2) {
    __assert_fail("new_item != HT_DELETED",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/external/hash/hash_table_impl.h"
                  ,0x74,"ht_item_t ht_insert(hash_table_t *, const void *, size_t, ht_item_t, int)")
    ;
  }
  if (len == 1) {
    __assert_fail("new_item != HT_NOMEM",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/external/hash/hash_table_impl.h"
                  ,0x75,"ht_item_t ht_insert(hash_table_t *, const void *, size_t, ht_item_t, int)")
    ;
  }
  if (len == 0) {
    __assert_fail("new_item != HT_MISSING",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/external/hash/hash_table_impl.h"
                  ,0x73,"ht_item_t ht_insert(hash_table_t *, const void *, size_t, ht_item_t, int)")
    ;
  }
  if (ht->buckets * 0xb3 >> 8 <= ht->count) {
    pvVar7 = (void *)(ht->count * 2);
    ht_00 = ht;
    iVar2 = ht_resize(ht,(size_t)pvVar7);
    if (iVar2 != 0) {
      ht_insert_cold_1();
      pfVar5 = ht_insert(ht_00,pvVar7,(size_t)pvVar7,
                         (ht_item_t_conflict5)(extraout_RDX & 0xffffffff),mode);
      return pfVar5;
    }
  }
  uVar6 = ht->buckets - 1;
  uVar1 = *(ushort *)((long)key + 0x10);
  if (uVar1 == 7) {
    uVar3 = (ulong)*key ^ 0x2f693b55;
LAB_0012885e:
    uVar3 = uVar3 * 0x9e3779b1;
  }
  else {
    if ((uVar1 == 6) || (uVar1 == 5)) {
      uVar3 = *key ^ (ulong)uVar1 ^ 0x2f693b52;
      goto LAB_0012885e;
    }
    uVar3 = 0;
  }
  pvVar7 = ht->table;
  uVar4 = uVar3 & uVar6;
  if (((uint)new_item & 0xfffffffe) != 2) {
    psVar8 = (size_t *)0x0;
    do {
      uVar3 = uVar3 + 1;
      psVar9 = (size_t *)((long)pvVar7 + uVar4 * 8);
      pfVar5 = (ht_item_t_conflict5)*psVar9;
      if (pfVar5 == (ht_item_t_conflict5)&DAT_00000002) {
        if (psVar8 == (size_t *)0x0) {
          psVar8 = psVar9;
        }
      }
      else {
        if (pfVar5 == (ht_item_t_conflict5)0x0) {
          if (psVar8 != (size_t *)0x0) {
            psVar9 = psVar8;
          }
          ht->count = ht->count + 1;
          goto LAB_00128904;
        }
        if (uVar1 == pfVar5->type) {
          if ((ulong)uVar1 == 7) {
            bVar10 = *key == (pfVar5->field_0).b;
          }
          else {
            if ((uVar1 != 6) && (uVar1 != 5)) goto LAB_001288e8;
            bVar10 = *key == (pfVar5->field_0).s.s;
          }
          if (bVar10) goto LAB_00128914;
        }
      }
LAB_001288e8:
      uVar4 = uVar3 & uVar6;
    } while( true );
  }
  ht->count = ht->count + 1;
  while (uVar3 = uVar3 + 1, (*(ulong *)((long)pvVar7 + uVar4 * 8) & 0xfffffffffffffffd) != 0) {
    uVar4 = uVar3 & uVar6;
  }
  psVar9 = (size_t *)((long)pvVar7 + uVar4 * 8);
LAB_00128904:
  pfVar5 = (ht_item_t_conflict5)0x0;
LAB_00128906:
  *psVar9 = len;
  return pfVar5;
LAB_00128914:
  if ((uint)new_item != 0) {
    return pfVar5;
  }
  goto LAB_00128906;
}

Assistant:

static ht_item_t ht_insert(hash_table_t *ht,
        const void *key, size_t len, ht_item_t new_item, int mode)
{
    ht_item_t *T;
    size_t N, i, j, k;
    ht_item_t item, *vacant = 0;

    assert(new_item != HT_MISSING);
    assert(new_item != HT_DELETED);
    assert(new_item != HT_NOMEM);

    if (ht->count >= ht->buckets * (HT_LOAD_FACTOR_FRAC) / 256) {
        if (ht_resize(ht, ht->count * 2)) {
            HT_PANIC("hash table failed to allocate memory during resize");
            return HT_NOMEM;
        }
    }
    T = ht->table;
    N = ht->buckets - 1;
    k = HT_HASH_FUNCTION(key, len);
    i = 0;
    j = HT_PROBE(k, i, N);
    if (mode == ht_unique || mode == ht_multi) {
        ++ht->count;
        while (T[j] && T[j] != HT_DELETED) {
            ++i;
            j = HT_PROBE(k, i, N);
        }
        T[j] = new_item;
        return 0;
    }
    while ((item = T[j])) {
        if (item == HT_DELETED) {
            if (vacant == 0) {
                /*
                 * If a tombstone was found, use the first available,
                 * but continue search for possible match.
                 */
                vacant = &T[j];
            }
        } else if (ht_match(key, len, item)) {
            if (mode == ht_replace) {
                T[j] = new_item;
            }
            return item;
        }
        ++i;
        j = HT_PROBE(k, i, N);
    }
    if (vacant == 0) {
        vacant = &T[j];
    }
    ++ht->count;
    *vacant = new_item;
    return 0;
}